

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

_Bool ggml_can_repeat(ggml_tensor *t0,ggml_tensor *t1)

{
  ulong uVar1;
  ulong uVar2;
  
  if (t0->ne[0] != 0) {
    uVar1 = 0;
    do {
      uVar2 = uVar1;
      if (uVar2 == 3) break;
      uVar1 = uVar2 + 1;
    } while (t0->ne[uVar2 + 1] != 0);
    if (2 < uVar2) {
      if (((t1->ne[0] % t0->ne[0] == 0) && (t1->ne[1] % t0->ne[1] == 0)) &&
         (t1->ne[2] % t0->ne[2] == 0)) {
        return t1->ne[3] % t0->ne[3] == 0;
      }
      return false;
    }
  }
  if (t1->ne[0] == 0) {
    return true;
  }
  uVar1 = 0;
  do {
    uVar2 = uVar1;
    if (uVar2 == 3) break;
    uVar1 = uVar2 + 1;
  } while (t1->ne[uVar2 + 1] != 0);
  return uVar2 < 3;
}

Assistant:

bool ggml_can_repeat(const struct ggml_tensor * t0, const struct ggml_tensor * t1) {
    static_assert(GGML_MAX_DIMS == 4, "GGML_MAX_DIMS is not 4 - update this function");

    return ggml_is_empty(t0) ? ggml_is_empty(t1) :
        (t1->ne[0]%t0->ne[0] == 0) &&
        (t1->ne[1]%t0->ne[1] == 0) &&
        (t1->ne[2]%t0->ne[2] == 0) &&
        (t1->ne[3]%t0->ne[3] == 0);
}